

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4random.c
# Opt level: O0

ssize_t read_all(int fd,uchar *buf,size_t count)

{
  ssize_t sVar1;
  ssize_t result;
  size_t numread;
  size_t count_local;
  uchar *buf_local;
  int fd_local;
  
  result = 0;
  while( true ) {
    if (count <= (ulong)result) {
      return result;
    }
    sVar1 = read(fd,buf + result,count - result);
    if (sVar1 < 0) break;
    if (sVar1 == 0) {
      return result;
    }
    result = sVar1 + result;
  }
  return -1;
}

Assistant:

static ssize_t
read_all(int fd, unsigned char *buf, size_t count)
{
	size_t numread = 0;
	ssize_t result;

	while (numread < count) {
		result = read(fd, buf+numread, count-numread);
		if (result<0)
			return -1;
		else if (result == 0)
			break;
		numread += result;
	}

	return (ssize_t)numread;
}